

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

int Gia_ManLutLevelWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int Fill;
  long lVar8;
  int iVar9;
  uint uVar10;
  
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    uVar10 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= (int)uVar10) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar9 = 0;
    if (p->pTravIds[(int)uVar10] != p->nTravIds) {
      p->pTravIds[(int)uVar10] = p->nTravIds;
      uVar6 = (uint)*(undefined8 *)pObj;
      iVar9 = 1;
      if ((~uVar6 & 0x9fffffff) != 0) {
        if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                        ,0x23a,"int Gia_ManLutLevelWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (pObj < pGVar2 + p->nObjs) {
          if (-1 < (int)uVar10) {
            lVar8 = 0;
            iVar9 = 0;
            while( true ) {
              iVar1 = p->vMapping->nSize;
              if (iVar1 <= (int)uVar10) break;
              piVar3 = p->vMapping->pArray;
              lVar7 = (long)piVar3[uVar10 & 0x7fffffff];
              if ((lVar7 < 0) || (iVar1 <= piVar3[uVar10 & 0x7fffffff])) break;
              if (piVar3[lVar7] <= lVar8) {
                pVVar4 = p->vLevels;
                Vec_IntFillExtra(pVVar4,uVar10 + 1,piVar3[lVar7]);
                if ((int)uVar10 < pVVar4->nSize) {
                  pVVar4->pArray[uVar10 & 0x7fffffff] = iVar9 + 1;
                  return 0;
                }
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              iVar1 = piVar3[lVar7 + lVar8 + 1];
              lVar7 = (long)iVar1;
              if ((lVar7 < 0) || (p->nObjs <= iVar1)) {
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              iVar5 = Gia_ManLutLevelWithBoxes_rec(p,p->pObjs + lVar7);
              if (iVar5 != 0) {
                return 1;
              }
              pVVar4 = p->vLevels;
              Vec_IntFillExtra(pVVar4,iVar1 + 1,Fill);
              if (pVVar4->nSize <= iVar1) break;
              if (iVar9 <= pVVar4->pArray[lVar7]) {
                iVar9 = pVVar4->pArray[lVar7];
              }
              lVar8 = lVar8 + 1;
              if ((int)uVar10 < 0) break;
            }
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        goto LAB_00234a1d;
      }
    }
    return iVar9;
  }
LAB_00234a1d:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ManLutLevelWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int iObj, k, iFan, Level = 0;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    iObj = Gia_ObjId( p, pObj );
    Gia_LutForEachFanin( p, iObj, iFan, k )
    {
        if ( Gia_ManLutLevelWithBoxes_rec( p, Gia_ManObj(p, iFan) ) )
            return 1;
        Level = Abc_MaxInt( Level, Gia_ObjLevelId(p, iFan) );
    }
    Gia_ObjSetLevelId( p, iObj, Level + 1 );
    return 0;
}